

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void addgrams(vw *all,size_t ngram,size_t skip_gram,features *fs,size_t initial_length,
             v_array<unsigned_long> *gram_mask,size_t skips)

{
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  unsigned_long *puVar1;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  element_type *peVar3;
  pointer pcVar4;
  undefined8 uVar5;
  _Alloc_hider all_00;
  size_type ngram_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  ulong uVar6;
  unsigned_long i;
  ulong uVar7;
  long lVar8;
  string feature_name;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90.first.field_2._M_allocated_capacity = initial_length;
  local_90.second._M_dataplus._M_p = (pointer)all;
  local_90.second._M_string_length = ngram;
  local_90.second.field_2._M_allocated_capacity = skip_gram;
  if ((ngram == 0) &&
     (local_90.second.field_2._8_8_ = initial_length - gram_mask->_end[-1],
     gram_mask->_end[-1] <= initial_length && local_90.second.field_2._8_8_ != 0)) {
    this = &fs->space_names;
    lVar8 = 0;
    do {
      puVar1 = (fs->indicies)._begin;
      i = puVar1[lVar8];
      uVar6 = (long)gram_mask->_end - (long)gram_mask->_begin >> 3;
      if (1 < uVar6) {
        uVar7 = 1;
        do {
          i = i * 0x1aa5cfd + puVar1[lVar8 + gram_mask->_begin[uVar7]];
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      local_90.first.field_2._8_8_ = lVar8;
      features::push_back(fs,1.0,i);
      uVar5 = local_90.first.field_2._8_8_;
      psVar2 = (fs->space_names)._begin;
      if ((fs->space_names)._end != psVar2) {
        peVar3 = psVar2[local_90.first.field_2._8_8_].
                 super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar4 = (peVar3->second)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar4,pcVar4 + (peVar3->second)._M_string_length);
        if (8 < (ulong)((long)gram_mask->_end - (long)gram_mask->_begin)) {
          uVar6 = 1;
          do {
            local_a0.
            super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = &local_90;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"^","");
            std::__cxx11::string::_M_append
                      ((char *)&local_50,
                       (ulong)local_a0.
                              super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
            if (local_a0.
                super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr != &local_90) {
              operator_delete(local_a0.
                              super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
            }
            peVar3 = this->_begin[uVar5 + gram_mask->_begin[uVar6]].
                     super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            pcVar4 = (peVar3->second)._M_dataplus._M_p;
            local_a0.
            super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = &local_90;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a0,pcVar4,pcVar4 + (peVar3->second)._M_string_length);
            std::__cxx11::string::_M_append
                      ((char *)&local_50,
                       (ulong)local_a0.
                              super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
            if (local_a0.
                super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr != &local_90) {
              operator_delete(local_a0.
                              super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 < (ulong)((long)gram_mask->_end - (long)gram_mask->_begin >> 3));
        }
        this_00 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)operator_new(0x40);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (this_00,&(this->_begin[uVar5].
                             super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->first,&local_50);
        local_a0.
        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = this_00;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<std::pair<std::__cxx11::string,std::__cxx11::string>*>
                  (&local_a0.
                    super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,this_00);
        v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back(this,&local_a0);
        if (local_a0.
            super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a0.
                     super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      lVar8 = local_90.first.field_2._8_8_ + 1;
    } while (lVar8 != local_90.second.field_2._8_8_);
  }
  uVar5 = local_90.second.field_2._M_allocated_capacity;
  ngram_00 = local_90.second._M_string_length;
  all_00._M_p = local_90.second._M_dataplus._M_p;
  if (local_90.second._M_string_length != 0) {
    local_50._M_dataplus._M_p = (pointer)(gram_mask->_end[-1] + skips + 1);
    v_array<unsigned_long>::push_back(gram_mask,(unsigned_long *)&local_50);
    addgrams((vw *)all_00._M_p,ngram_00 - 1,uVar5,fs,local_90.first.field_2._M_allocated_capacity,
             gram_mask,0);
    gram_mask->_end = gram_mask->_end + -1;
  }
  if (uVar5 != 0 && ngram_00 != 0) {
    addgrams((vw *)all_00._M_p,ngram_00,uVar5 - 1,fs,local_90.first.field_2._M_allocated_capacity,
             gram_mask,skips + 1);
  }
  return;
}

Assistant:

void addgrams(vw& all, size_t ngram, size_t skip_gram, features& fs, size_t initial_length, v_array<size_t>& gram_mask,
    size_t skips)
{
  if (ngram == 0 && gram_mask.last() < initial_length)
  {
    size_t last = initial_length - gram_mask.last();
    for (size_t i = 0; i < last; i++)
    {
      uint64_t new_index = fs.indicies[i];
      for (size_t n = 1; n < gram_mask.size(); n++)
        new_index = new_index * quadratic_constant + fs.indicies[i + gram_mask[n]];

      fs.push_back(1., new_index);
      if (fs.space_names.size() > 0)
      {
        string feature_name(fs.space_names[i].get()->second);
        for (size_t n = 1; n < gram_mask.size(); n++)
        {
          feature_name += string("^");
          feature_name += string(fs.space_names[i + gram_mask[n]].get()->second);
        }
        fs.space_names.push_back(audit_strings_ptr(new audit_strings(fs.space_names[i].get()->first, feature_name)));
      }
    }
  }
  if (ngram > 0)
  {
    gram_mask.push_back(gram_mask.last() + 1 + skips);
    addgrams(all, ngram - 1, skip_gram, fs, initial_length, gram_mask, 0);
    gram_mask.pop();
  }
  if (skip_gram > 0 && ngram > 0)
    addgrams(all, ngram, skip_gram - 1, fs, initial_length, gram_mask, skips + 1);
}